

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O3

void __thiscall
ParamsWrapper<CNetAddr::SerParams,_CService>::Serialize<VectorWriter>
          (ParamsWrapper<CNetAddr::SerParams,_CService> *this,VectorWriter *s)

{
  CService *this_00;
  ulong uVar1;
  size_t in_RCX;
  long in_FS_OFFSET;
  ParamsStream<VectorWriter_&,_CNetAddr::SerParams> ss;
  uint64_t raw;
  ParamsStream<VectorWriter_&,_CNetAddr::SerParams> local_30;
  ulong local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.m_params = this->m_params;
  this_00 = this->m_object;
  local_30.m_substream = s;
  CNetAddr::Serialize<ParamsStream<VectorWriter&,CNetAddr::SerParams>>
            (&this_00->super_CNetAddr,&local_30);
  uVar1 = (ulong)this_00->port;
  local_20 = (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
  VectorWriter::write(local_30.m_substream,(int)&local_20 + 6,(void *)0x2,in_RCX);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Serialize(Stream& s) const
    {
        ParamsStream ss{s, m_params};
        ::Serialize(ss, m_object);
    }